

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingMismatchedDoubleUniformFunctions
          (GPUShaderFP64Test1 *this)

{
  GPUShaderFP64Test1 *this_00;
  int iVar1;
  deUint32 err;
  _uniform_function _Var2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  size_t sVar5;
  TestError *this_01;
  long lVar6;
  _uniform_function func;
  undefined8 *puVar7;
  undefined8 *puVar8;
  GPUShaderFP64Test1 *this_02;
  bool bVar9;
  long lVar10;
  GLint double_uniform_locations [13];
  double double_data [16];
  GLint local_278 [14];
  long local_240;
  undefined8 local_238 [17];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  puVar7 = &DAT_01a88860;
  puVar8 = local_238;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + 1;
    puVar8 = puVar8 + 1;
  }
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar1);
  local_278[0] = this->m_po_dmat2_uniform_location;
  local_278[1] = this->m_po_dmat2x3_uniform_location;
  local_278[2] = this->m_po_dmat2x4_uniform_location;
  local_278[3] = this->m_po_dmat3_uniform_location;
  local_278[4] = this->m_po_dmat3x2_uniform_location;
  local_278[5] = this->m_po_dmat3x4_uniform_location;
  local_278[6] = this->m_po_dmat4_uniform_location;
  local_278[7] = this->m_po_dmat4x2_uniform_location;
  local_278[8] = this->m_po_dmat4x3_uniform_location;
  local_278[9] = this->m_po_double_uniform_location;
  local_278[10] = this->m_po_dvec2_uniform_location;
  local_278[0xb] = this->m_po_dvec3_uniform_location;
  local_278[0xc] = this->m_po_dvec4_uniform_location;
  (**(code **)(lVar6 + 0x1680))(this->m_po_id);
  err = (**(code **)(lVar6 + 0x800))();
  glu::checkError(err,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xb03);
  bVar9 = true;
  lVar10 = 0;
  do {
    iVar1 = local_278[lVar10];
    func = UNIFORM_FUNCTION_1D;
    do {
      if ((((((func != UNIFORM_FUNCTION_MATRIX2DV) || (iVar1 != this->m_po_dmat2_uniform_location))
            && ((func != UNIFORM_FUNCTION_MATRIX2X3DV ||
                (iVar1 != this->m_po_dmat2x3_uniform_location)))) &&
           ((func != UNIFORM_FUNCTION_MATRIX2X4DV || (iVar1 != this->m_po_dmat2x4_uniform_location))
           )) && (((((func != UNIFORM_FUNCTION_MATRIX3DV ||
                     (iVar1 != this->m_po_dmat3_uniform_location)) &&
                    ((((func != UNIFORM_FUNCTION_MATRIX3X2DV ||
                       (iVar1 != this->m_po_dmat3x2_uniform_location)) &&
                      ((func != UNIFORM_FUNCTION_MATRIX3X4DV ||
                       (iVar1 != this->m_po_dmat3x4_uniform_location)))) &&
                     ((func != UNIFORM_FUNCTION_MATRIX4DV ||
                      (iVar1 != this->m_po_dmat4_uniform_location)))))) &&
                   ((func != UNIFORM_FUNCTION_MATRIX4X2DV ||
                    (iVar1 != this->m_po_dmat4x2_uniform_location)))) &&
                  ((((func != UNIFORM_FUNCTION_MATRIX4X3DV ||
                     (iVar1 != this->m_po_dmat4x3_uniform_location)) &&
                    ((UNIFORM_FUNCTION_1DV < func || (iVar1 != this->m_po_double_uniform_location)))
                    ) && (((_Var2 = func & (UNIFORM_FUNCTION_MATRIX4X3DV|UNIFORM_FUNCTION_MATRIX4DV)
                           , _Var2 != UNIFORM_FUNCTION_2D ||
                           (iVar1 != this->m_po_dvec2_uniform_location)) &&
                          ((_Var2 != UNIFORM_FUNCTION_3D ||
                           (iVar1 != this->m_po_dvec3_uniform_location)))))))))) &&
         ((_Var2 != UNIFORM_FUNCTION_4D || (iVar1 != this->m_po_dvec4_uniform_location)))) {
        switch(func) {
        case UNIFORM_FUNCTION_1D:
          (**(code **)(lVar6 + 0x14d0))(local_238[0],iVar1);
          break;
        case UNIFORM_FUNCTION_1DV:
          (**(code **)(lVar6 + 0x14d8))(iVar1,1,local_238);
          break;
        case UNIFORM_FUNCTION_2D:
          (**(code **)(lVar6 + 0x1510))(local_238[0],local_238[1],iVar1);
          break;
        case UNIFORM_FUNCTION_2DV:
          (**(code **)(lVar6 + 0x1518))(iVar1,1,local_238);
          break;
        case UNIFORM_FUNCTION_3D:
          (**(code **)(lVar6 + 0x1550))(local_238[0],local_238[1],local_238[2],iVar1);
          break;
        case UNIFORM_FUNCTION_3DV:
          (**(code **)(lVar6 + 0x1558))(iVar1,1,local_238);
          break;
        case UNIFORM_FUNCTION_4D:
          (**(code **)(lVar6 + 0x1590))(local_238[0],local_238[1],local_238[2],local_238[3],iVar1);
          break;
        case UNIFORM_FUNCTION_4DV:
          (**(code **)(lVar6 + 0x1598))(iVar1,1,local_238);
          break;
        case UNIFORM_FUNCTION_MATRIX2DV:
          (**(code **)(lVar6 + 0x15d8))(iVar1,1,0,local_238);
          break;
        case UNIFORM_FUNCTION_MATRIX2X3DV:
          (**(code **)(lVar6 + 0x15e8))(iVar1,1,0,local_238);
          break;
        case UNIFORM_FUNCTION_MATRIX2X4DV:
          (**(code **)(lVar6 + 0x15f8))(iVar1,1,0,local_238);
          break;
        case UNIFORM_FUNCTION_MATRIX3DV:
          (**(code **)(lVar6 + 0x1608))(iVar1,1,0,local_238);
          break;
        case UNIFORM_FUNCTION_MATRIX3X2DV:
          (**(code **)(lVar6 + 0x1618))(iVar1,1,0,local_238);
          break;
        case UNIFORM_FUNCTION_MATRIX3X4DV:
          (**(code **)(lVar6 + 0x1628))(iVar1,1,0,local_238);
          break;
        case UNIFORM_FUNCTION_MATRIX4DV:
          (**(code **)(lVar6 + 0x1638))(iVar1,1,0,local_238);
          break;
        case UNIFORM_FUNCTION_MATRIX4X2DV:
          (**(code **)(lVar6 + 0x1648))(iVar1,1,0,local_238);
          break;
        case UNIFORM_FUNCTION_MATRIX4X3DV:
          (**(code **)(lVar6 + 0x1658))(iVar1,1,0,local_238);
          break;
        default:
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_01,"Unrecognized function",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                     ,0xb6b);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        iVar3 = (**(code **)(lVar6 + 0x800))();
        if (iVar3 != 0x502) {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          this_00 = (GPUShaderFP64Test1 *)(local_1b0 + 8);
          local_240 = lVar6;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Invalid error [",0xf);
          std::ostream::_M_insert<unsigned_long>((ulong)this_00);
          this_02 = this_00;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,
                     "] was generated when a mismatched double-precision uniform function ",0x44);
          pcVar4 = getUniformFunctionString(this_02,func);
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"() was used to configure uniform ",0x21);
          pcVar4 = getUniformNameForLocation(this,iVar1);
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar4,sVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          std::ios_base::~ios_base(local_138);
          bVar9 = false;
          lVar6 = local_240;
        }
      }
      func = func + UNIFORM_FUNCTION_1DV;
    } while (func != UNIFORM_FUNCTION_COUNT);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0xd);
  return bVar9;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingMismatchedDoubleUniformFunctions()
{
	const double		  double_data[] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };
	glw::GLenum			  error_code	= GL_NO_ERROR;
	const glw::Functions& gl			= m_context.getRenderContext().getFunctions();
	bool				  result		= true;

	const glw::GLint double_uniform_locations[] = { m_po_dmat2_uniform_location,   m_po_dmat2x3_uniform_location,
													m_po_dmat2x4_uniform_location, m_po_dmat3_uniform_location,
													m_po_dmat3x2_uniform_location, m_po_dmat3x4_uniform_location,
													m_po_dmat4_uniform_location,   m_po_dmat4x2_uniform_location,
													m_po_dmat4x3_uniform_location, m_po_double_uniform_location,
													m_po_dvec2_uniform_location,   m_po_dvec3_uniform_location,
													m_po_dvec4_uniform_location };
	const unsigned int n_double_uniform_locations =
		sizeof(double_uniform_locations) / sizeof(double_uniform_locations[0]);

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	for (unsigned int n_uniform_location = 0; n_uniform_location < n_double_uniform_locations; ++n_uniform_location)
	{
		glw::GLint uniform_location = double_uniform_locations[n_uniform_location];

		for (int function = static_cast<int>(UNIFORM_FUNCTION_FIRST);
			 function < static_cast<int>(UNIFORM_FUNCTION_COUNT); function++)
		{
			_uniform_function e_function = static_cast<_uniform_function>(function);
			/* Exclude valid combinations */
			if (((uniform_location == m_po_dmat2_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX2DV)) ||
				((uniform_location == m_po_dmat2x3_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX2X3DV)) ||
				((uniform_location == m_po_dmat2x4_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX2X4DV)) ||
				((uniform_location == m_po_dmat3_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX3DV)) ||
				((uniform_location == m_po_dmat3x2_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX3X2DV)) ||
				((uniform_location == m_po_dmat3x4_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX3X4DV)) ||
				((uniform_location == m_po_dmat4_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX4DV)) ||
				((uniform_location == m_po_dmat4x2_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX4X2DV)) ||
				((uniform_location == m_po_dmat4x3_uniform_location) && (e_function == UNIFORM_FUNCTION_MATRIX4X3DV)) ||
				((uniform_location == m_po_double_uniform_location) &&
				 ((e_function == UNIFORM_FUNCTION_1D) || (e_function == UNIFORM_FUNCTION_1DV))) ||
				((uniform_location == m_po_dvec2_uniform_location) &&
				 ((e_function == UNIFORM_FUNCTION_2D) || (e_function == UNIFORM_FUNCTION_2DV))) ||
				((uniform_location == m_po_dvec3_uniform_location) &&
				 ((e_function == UNIFORM_FUNCTION_3D) || (e_function == UNIFORM_FUNCTION_3DV))) ||
				((uniform_location == m_po_dvec4_uniform_location) &&
				 ((e_function == UNIFORM_FUNCTION_4D) || (e_function == UNIFORM_FUNCTION_4DV))))
			{
				continue;
			}

			switch (e_function)
			{
			case UNIFORM_FUNCTION_1D:
			{
				gl.uniform1d(uniform_location, double_data[0]);

				break;
			}

			case UNIFORM_FUNCTION_2D:
			{
				gl.uniform2d(uniform_location, double_data[0], double_data[1]);

				break;
			}

			case UNIFORM_FUNCTION_3D:
			{
				gl.uniform3d(uniform_location, double_data[0], double_data[1], double_data[2]);

				break;
			}

			case UNIFORM_FUNCTION_4D:
			{
				gl.uniform4d(uniform_location, double_data[0], double_data[1], double_data[2], double_data[3]);

				break;
			}

			case UNIFORM_FUNCTION_1DV:
				gl.uniform1dv(uniform_location, 1 /* count */, double_data);
				break;
			case UNIFORM_FUNCTION_2DV:
				gl.uniform2dv(uniform_location, 1 /* count */, double_data);
				break;
			case UNIFORM_FUNCTION_3DV:
				gl.uniform3dv(uniform_location, 1 /* count */, double_data);
				break;
			case UNIFORM_FUNCTION_4DV:
				gl.uniform4dv(uniform_location, 1 /* count */, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2DV:
				gl.uniformMatrix2dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X3DV:
				gl.uniformMatrix2x3dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X4DV:
				gl.uniformMatrix2x4dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3DV:
				gl.uniformMatrix3dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X2DV:
				gl.uniformMatrix3x2dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X4DV:
				gl.uniformMatrix3x4dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4DV:
				gl.uniformMatrix4dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X2DV:
				gl.uniformMatrix4x2dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X3DV:
				gl.uniformMatrix4x3dv(uniform_location, 1 /* count */, GL_FALSE, double_data);
				break;

			default:
			{
				TCU_FAIL("Unrecognized function");
			}
			} /* switch (function) */

			/* Make sure GL_INVALID_OPERATION error was generated */
			error_code = gl.getError();

			if (error_code != GL_INVALID_OPERATION)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid error [" << error_code
								   << "] was generated when a mismatched "
									  "double-precision uniform function "
								   << getUniformFunctionString(e_function) << "() was used to configure uniform "
								   << getUniformNameForLocation(uniform_location) << "." << tcu::TestLog::EndMessage;

				result = false;
			}
		} /* for (all uniform functions) */
	}	 /* for (all uniform locations) */

	return result;
}